

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool SearchPolylinePart(ON_RTreeNode *a_node,ON_Polyline *polyline,int from,int plcount,
                       ON_RTreeSearchPolylineResultCallback *result)

{
  ON_RTreeBBox *a_rectB;
  ON_3dPoint *pOVar1;
  int *piVar2;
  bool bVar3;
  ON_RTreeBBox *a_rectA;
  int from_00;
  long lVar4;
  ulong uVar5;
  uint count;
  long lVar6;
  ulong uVar7;
  int count_00;
  long lVar8;
  bool bVar9;
  ON_BoundingBox local_60;
  
  if (plcount < 3) {
    if (plcount == 2) {
      pOVar1 = (polyline->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
      piVar2 = (int *)(result->super_ON_RTreeSearchResultCallback).m_context;
      if (piVar2 != (int *)0x0) {
        *piVar2 = from;
      }
      bVar9 = SearchHelper(a_node,(ON_Line *)(pOVar1 + (uint)from),
                           &result->super_ON_RTreeSearchResultCallback);
      return bVar9;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
               ,0x4bd,"","Unexpected plcount");
    bVar9 = true;
  }
  else {
    lVar4 = (long)a_node->m_count;
    bVar9 = true;
    if (0 < lVar4) {
      if (a_node->m_level < 1) {
        for (lVar8 = 0; lVar8 != lVar4; lVar8 = lVar8 + 1) {
          uVar5 = (ulong)(plcount - 1);
          lVar6 = (long)from * 0x18;
          uVar7 = (ulong)(uint)from;
          while (bVar3 = uVar5 != 0, uVar5 = uVar5 - 1, bVar3) {
            bVar3 = OverlapLineHelper((ON_Line *)
                                      ((long)&((polyline->super_ON_3dPointArray).
                                               super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar6),
                                      &a_node->m_branch[lVar8].m_rect);
            if (bVar3) {
              piVar2 = (int *)(result->super_ON_RTreeSearchResultCallback).m_context;
              if (piVar2 != (int *)0x0) {
                *piVar2 = (int)uVar7;
              }
              bVar3 = (*(result->super_ON_RTreeSearchResultCallback).m_resultCallback)
                                (piVar2,(ON__INT_PTR)(&a_node->m_branch[lVar8].m_rect)[1].m_min[0]);
              if (!bVar3) {
                return false;
              }
            }
            uVar7 = (ulong)((int)uVar7 + 1);
            lVar6 = lVar6 + 0x18;
          }
        }
      }
      else {
        count = plcount + 1U >> 1;
        a_rectA = (ON_RTreeBBox *)ON_Workspace::GetMemory(result->m_ws,0x60);
        ON_3dPointArray::BoundingBox(&local_60,&polyline->super_ON_3dPointArray,from,count);
        a_rectA->m_max[1] = local_60.m_max.y;
        a_rectA->m_max[2] = local_60.m_max.z;
        a_rectA->m_min[2] = local_60.m_min.z;
        a_rectA->m_max[0] = local_60.m_max.x;
        a_rectA->m_min[0] = local_60.m_min.x;
        a_rectA->m_min[1] = local_60.m_min.y;
        from_00 = from + -1 + count;
        count_00 = (plcount - count) + 1;
        ON_3dPointArray::BoundingBox(&local_60,&polyline->super_ON_3dPointArray,from_00,count_00);
        a_rectA[1].m_max[1] = local_60.m_max.y;
        a_rectA[1].m_max[2] = local_60.m_max.z;
        a_rectA[1].m_min[2] = local_60.m_min.z;
        a_rectA[1].m_max[0] = local_60.m_max.x;
        a_rectA[1].m_min[0] = local_60.m_min.x;
        a_rectA[1].m_min[1] = local_60.m_min.y;
        for (lVar8 = 0; bVar9 = lVar4 * 0x38 - lVar8 == 0, !bVar9; lVar8 = lVar8 + 0x38) {
          a_rectB = (ON_RTreeBBox *)((long)a_node->m_branch[0].m_rect.m_min + lVar8);
          bVar3 = OverlapHelper(a_rectA,a_rectB);
          if ((bVar3) &&
             (bVar3 = SearchPolylinePart(*(ON_RTreeNode **)
                                          ((long)(&a_node->m_branch[0].m_rect + 1) + lVar8),polyline
                                         ,from,count,result), !bVar3)) {
            return bVar9;
          }
          bVar3 = OverlapHelper(a_rectA + 1,a_rectB);
          if ((bVar3) &&
             (bVar3 = SearchPolylinePart(*(ON_RTreeNode **)
                                          ((long)(&a_node->m_branch[0].m_rect + 1) + lVar8),polyline
                                         ,from_00,count_00,result), !bVar3)) {
            return bVar9;
          }
        }
      }
    }
  }
  return bVar9;
}

Assistant:

static bool SearchPolylinePart(const ON_RTreeNode* a_node, const ON_Polyline* polyline, int from, int plcount,
  ON_RTreeSearchPolylineResultCallback& result)
{
  if (plcount > 2)
  {
    int i, count, innercount;

    if ((count = a_node->m_count) > 0)
    {
      const ON_RTreeBranch* branch = a_node->m_branch;
      if (a_node->IsInternalNode())
      {
        innercount = (plcount + 1) / 2;
        auto bb = (ON_BoundingBox*)result.m_ws->GetMemory(sizeof(ON_BoundingBox) * 2);
        *bb = polyline->BoundingBox(from, innercount);
        *(bb + 1) = polyline->BoundingBox(from + innercount - 1, plcount - innercount + 1);

        for (i = 0; i < count; ++i)
        {
          if (OverlapHelper((ON_RTreeBBox*)bb, &branch[i].m_rect))
          {
            if (!SearchPolylinePart(branch[i].m_child, polyline, from, innercount, result))
            {
              return false; // Don't continue searching
            }
          }
          if (OverlapHelper((ON_RTreeBBox*)bb+1, &branch[i].m_rect))
          {
            if (!SearchPolylinePart(branch[i].m_child, polyline, from + innercount - 1, plcount - innercount + 1, result))
            {
              return false; // Don't continue searching
            }
          }
        }
      }
      else
      {
        // a_node is a leaf node
        for (i = 0; i < count; ++i)
        {
          for (innercount = 0; innercount < (plcount-1); innercount++)
          {
            ON_Line* line = (ON_Line*)(&polyline->Array()[innercount + from]);
            if (OverlapLineHelper(line, &branch[i].m_rect))
            {
              if (result.m_context) ((ON_RTreePolylineContext*)result.m_context)->m_polyline_pointindex = innercount + from;
              if (!result.m_resultCallback(result.m_context, branch[i].m_id))
              {
                // callback canceled search
                return false;
              }
            }
          }
        }
      }
    }
  }
  else if (plcount == 2)
  {
    ON_Line* line = (ON_Line*)(&polyline->Array()[from]);
    if (result.m_context) ((ON_RTreePolylineContext*)result.m_context)->m_polyline_pointindex = from;
    return SearchHelper(a_node, line, result);
  }
  else if (plcount < 2)
  {
    ON_ERROR("Unexpected plcount");
    return true;
  }

  return true;
}